

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O0

Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *
squareRoot(Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *__return_storage_ptr__,uint64_t x,
          uint64_t n)

{
  bool bVar1;
  Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *pRVar2;
  unsigned_long *in_RCX;
  undefined1 auVar3 [16];
  Rational<scp::BigInt<unsigned_int,_unsigned_long>_> local_178;
  Rational<scp::BigInt<unsigned_int,_unsigned_long>_> local_130;
  undefined1 local_e8 [8];
  BigInt<unsigned_int,_unsigned_long> eps;
  BigInt<unsigned_int,_unsigned_long> local_c0;
  undefined1 local_a0 [8];
  BigInt<unsigned_int,_unsigned_long> lim;
  BigInt<unsigned_int,_unsigned_long> local_70;
  BigInt<unsigned_int,_unsigned_long> local_50;
  byte local_29;
  long local_28;
  int64_t y;
  uint64_t n_local;
  uint64_t x_local;
  Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *result;
  
  for (local_28 = 1; (ulong)(local_28 * local_28) < x; local_28 = local_28 + 1) {
  }
  local_29 = 0;
  y = n;
  n_local = x;
  x_local = (uint64_t)__return_storage_ptr__;
  scp::BigInt<unsigned_int,_unsigned_long>::BigInt(&local_50,local_28 * 2 + 1);
  scp::BigInt<unsigned_int,_unsigned_long>::BigInt(&local_70,2);
  scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::Rational
            (__return_storage_ptr__,&local_50,&local_70);
  scp::BigInt<unsigned_int,_unsigned_long>::~BigInt(&local_70);
  scp::BigInt<unsigned_int,_unsigned_long>::~BigInt(&local_50);
  scp::BigInt<unsigned_int,_unsigned_long>::BigInt(&local_c0,10);
  eps._24_8_ = y + 1;
  scp::pow<scp::BigInt<unsigned_int,unsigned_long>,unsigned_long>
            ((BigInt<unsigned_int,_unsigned_long> *)local_a0,(scp *)&local_c0,
             (BigInt<unsigned_int,_unsigned_long> *)&eps._positive,in_RCX);
  scp::BigInt<unsigned_int,_unsigned_long>::~BigInt(&local_c0);
  scp::BigInt<unsigned_int,_unsigned_long>::BigInt
            ((BigInt<unsigned_int,_unsigned_long> *)local_e8,2);
  while( true ) {
    bVar1 = scp::BigInt<unsigned_int,_unsigned_long>::operator<
                      ((BigInt<unsigned_int,_unsigned_long> *)local_e8,
                       (BigInt<unsigned_int,_unsigned_long> *)local_a0);
    if (!bVar1) break;
    scp::BigInt<unsigned_int,_unsigned_long>::operator*=
              ((BigInt<unsigned_int,_unsigned_long> *)local_e8,
               (BigInt<unsigned_int,_unsigned_long> *)local_e8);
    scp::operator*(&local_130,__return_storage_ptr__,__return_storage_ptr__);
    auVar3._8_4_ = (int)(n_local >> 0x20);
    auVar3._0_8_ = n_local;
    auVar3._12_4_ = 0x45300000;
    pRVar2 = scp::operator+(&local_130,
                            (auVar3._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)n_local) - 4503599627370496.0));
    scp::operator*(&local_178,2.0,__return_storage_ptr__);
    pRVar2 = scp::operator/(pRVar2,&local_178);
    scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::operator=
              (__return_storage_ptr__,pRVar2);
    scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::~Rational(&local_178);
    scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::~Rational(&local_130);
  }
  local_29 = 1;
  scp::BigInt<unsigned_int,_unsigned_long>::~BigInt((BigInt<unsigned_int,_unsigned_long> *)local_e8)
  ;
  scp::BigInt<unsigned_int,_unsigned_long>::~BigInt((BigInt<unsigned_int,_unsigned_long> *)local_a0)
  ;
  if ((local_29 & 1) == 0) {
    scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::~Rational(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

scp::Rational<> squareRoot(uint64_t x, uint64_t n)
{
	int64_t y = 1;
	while (y*y < x)
	{
		++y;
	}

	scp::Rational<> result = { 2 * y + 1, 2 };
	scp::BigInt<> lim = scp::pow(scp::BigInt<>(10), n + 1);
	scp::BigInt<> eps = 2;
	while (eps < lim)
	{
		eps *= eps;
		result = (result*result + x) / (2 * result);
	}

	return result;
}